

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t
psa_key_derivation_setup_kdf(psa_key_derivation_operation_t *operation,psa_algorithm_t kdf_alg)

{
  psa_status_t pVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  
  memset(&operation->ctx,0,0x208);
  uVar2 = kdf_alg & 0xffffff00;
  pVar1 = -0x86;
  if (((uVar2 == 0x20000100) || (uVar2 == 0x20000300)) || (uVar2 == 0x20000200)) {
    uVar3 = kdf_alg & 0xff;
    uVar4 = uVar3 - 1;
    if (((byte)uVar4 < 0x12) && ((0x39f9fU >> (uVar4 & 0x1f) & 1) != 0)) {
      lVar5 = *(long *)(&DAT_001406d0 + (ulong)(uVar4 & 0xff) * 8);
    }
    else {
      lVar5 = (ulong)(uVar3 == 0x13) << 6;
    }
    if ((lVar5 != 0) && (((uVar2 != 0x20000200 && (uVar2 != 0x20000300)) || (uVar3 - 9 < 2)))) {
      operation->capacity = lVar5 * 0xff;
      pVar1 = 0;
    }
  }
  return pVar1;
}

Assistant:

static psa_status_t psa_key_derivation_setup_kdf(
    psa_key_derivation_operation_t *operation,
    psa_algorithm_t kdf_alg )
{
    /* Make sure that operation->ctx is properly zero-initialised. (Macro
     * initialisers for this union leave some bytes unspecified.) */
    memset( &operation->ctx, 0, sizeof( operation->ctx ) );

    /* Make sure that kdf_alg is a supported key derivation algorithm. */
#if defined(MBEDTLS_MD_C)
    if( PSA_ALG_IS_HKDF( kdf_alg ) ||
        PSA_ALG_IS_TLS12_PRF( kdf_alg ) ||
        PSA_ALG_IS_TLS12_PSK_TO_MS( kdf_alg ) )
    {
        psa_algorithm_t hash_alg = PSA_ALG_HKDF_GET_HASH( kdf_alg );
        size_t hash_size = PSA_HASH_SIZE( hash_alg );
        if( hash_size == 0 )
            return( PSA_ERROR_NOT_SUPPORTED );
        if( ( PSA_ALG_IS_TLS12_PRF( kdf_alg ) ||
              PSA_ALG_IS_TLS12_PSK_TO_MS( kdf_alg ) ) &&
            ! ( hash_alg == PSA_ALG_SHA_256 || hash_alg == PSA_ALG_SHA_384 ) )
        {
            return( PSA_ERROR_NOT_SUPPORTED );
        }
        operation->capacity = 255 * hash_size;
        return( PSA_SUCCESS );
    }
#endif /* MBEDTLS_MD_C */
    else
        return( PSA_ERROR_NOT_SUPPORTED );
}